

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

void __thiscall soul::AST::ModuleBase::performLocalNameSearch(ModuleBase *this)

{
  Statement *in_RDX;
  NameSearch *in_RSI;
  
  performLocalNameSearch((ModuleBase *)&this[-1].createClone,in_RSI,in_RDX);
  return;
}

Assistant:

void performLocalNameSearch (NameSearch& search, const Statement*) const override
        {
            auto targetName = search.partiallyQualifiedPath.getLastPart();

            if (search.findVariables)
                search.addFirstWithName (getVariables(), targetName);

            if (search.findTypes)
            {
                search.addFirstWithName (getStructDeclarations(), targetName);
                search.addFirstWithName (getUsingDeclarations(), targetName);
            }

            if (search.findFunctions)
            {
                for (auto& f : getFunctions())
                {
                    if (f->name == targetName
                         && (search.requiredNumFunctionArgs < 0
                              || f->parameters.size() == static_cast<uint32_t> (search.requiredNumFunctionArgs)))
                    {
                        search.addResult (f);
                    }
                }
            }

            if (search.findEndpoints)
                search.addFirstWithName (getEndpoints(), targetName);

            if (search.findNamespaces || search.findProcessors)
            {
                for (auto& m : getSubModules())
                {
                    if (m->name == targetName)
                    {
                        if ((search.findNamespaces && m->isNamespace())
                             || (search.findProcessors && (m->isProcessor() || m->isGraph())))
                        {
                            search.addResult (m);
                            break;
                        }
                    }
                }

                if (search.findNamespaces)  search.addFirstWithName (getNamespaceAliases(), targetName);
                if (search.findProcessors)  search.addFirstWithName (getProcessorAliases(), targetName);
            }
        }